

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::TiledRgbaInputFile::FromYa::readTile(FromYa *this,int dx,int dy,int lx,int ly)

{
  Rgba *pRVar1;
  long lVar2;
  Rgba *pRVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  ArgExc *this_00;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int x1;
  long lVar12;
  Box2i dw;
  ostream local_1a8 [376];
  
  if (this->_fbBase != (Rgba *)0x0) {
    TiledInputFile::readTile(this->_inputFile,dx,dy,lx,ly);
    TiledInputFile::dataWindowForTile((TiledInputFile *)&dw,(int)this->_inputFile,dx,dy,lx);
    lVar7 = (long)dw.max.x;
    lVar4 = (long)dw.min.x;
    pRVar1 = this->_fbBase;
    lVar8 = 0;
    lVar11 = 0;
    for (lVar9 = (long)dw.min.y; lVar9 <= dw.max.y; lVar9 = lVar9 + 1) {
      lVar10 = 0;
      lVar12 = 0;
      while( true ) {
        lVar2 = (this->_buf)._sizeY;
        pRVar3 = (this->_buf)._data;
        if (lVar7 - lVar4 < lVar12) break;
        Imath_3_2::half::operator=((half *)((long)&(pRVar3->r)._h + lVar2 * lVar8 + lVar10),0.0);
        Imath_3_2::half::operator=
                  ((half *)((long)&(((this->_buf)._data)->b)._h +
                           lVar10 + (this->_buf)._sizeY * lVar8),0.0);
        lVar12 = lVar12 + 1;
        lVar10 = lVar10 + 8;
      }
      pRVar3 = pRVar3 + lVar2 * lVar11;
      RgbaYca::YCAtoRGBA(&this->_yw,(int)(lVar7 - lVar4) + 1,pRVar3,pRVar3);
      for (lVar10 = 0; dw.min.x + lVar10 <= (long)dw.max.x; lVar10 = lVar10 + 1) {
        pRVar1[this->_fbYStride * lVar9 + (dw.min.x + lVar10) * this->_fbXStride] =
             *(Rgba *)((long)&(this->_buf)._data[lVar10].r._h + (this->_buf)._sizeY * lVar8);
      }
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 8;
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&dw);
  poVar5 = std::operator<<(local_1a8,
                           "No frame buffer was specified as the pixel data destination for image file \""
                          );
  pcVar6 = TiledInputFile::fileName(this->_inputFile);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,(stringstream *)&dw);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
TiledRgbaInputFile::FromYa::readTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data destination for image file "
            "\"" << _inputFile.fileName ()
                 << "\".");
    }

    //
    // Read the tile requested by the caller into _buf.
    //

    _inputFile.readTile (dx, dy, lx, ly);

    //
    // Convert the luminance/alpha pixels to RGBA
    // and copy them into the caller's frame buffer.
    //

    Box2i    dw    = _inputFile.dataWindowForTile (dx, dy, lx, ly);
    int      width = dw.max.x - dw.min.x + 1;
    intptr_t base  = reinterpret_cast<intptr_t> (_fbBase);

    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
        for (int x1 = 0; x1 < width; ++x1)
        {
            _buf[y1][x1].r = 0;
            _buf[y1][x1].b = 0;
        }

        YCAtoRGBA (_yw, width, _buf[y1], _buf[y1]);

        for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
        {
            Rgba* ptr = reinterpret_cast<Rgba*> (
                base + sizeof (Rgba) * (x * _fbXStride + y * _fbYStride));
            *ptr = _buf[y1][x1];
        }
    }
}